

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryProgramQueryCase::iterate
          (GeometryProgramQueryCase *this)

{
  pointer *pppSVar1;
  pointer *this_00;
  TestLog *pTVar2;
  RenderContext *pRVar3;
  TestContext *this_01;
  bool bVar4;
  ContextType CVar5;
  GLSLVersion GVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  char *pcVar10;
  ProgramSources *pPVar11;
  undefined4 extraout_var;
  TestError *this_02;
  long lVar12;
  allocator<char> local_439;
  ScopedLogSection section;
  long local_430;
  char *fragSourcePtr;
  char *geomSourcePtr;
  ScopedLogSection section_1;
  deUint32 local_410 [14];
  long local_3d8;
  StateQueryMemoryWriteGuard<int> state;
  bool local_378;
  char *vtxSourcePtr;
  string geometrySource;
  Shader fragmentShader;
  string fragmentSource;
  string vertexSource;
  ShaderProgram program;
  ShaderProgram program_1;
  
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar6 = glu::getContextTypeGLSLVersion(CVar5);
  pcVar10 = glu::getGLSLVersionDeclaration(GVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,pcVar10,(allocator<char> *)&program);
  std::operator+(&vertexSource,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program_1,
                 "\nvoid main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n");
  std::__cxx11::string::~string((string *)&program_1);
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar6 = glu::getContextTypeGLSLVersion(CVar5);
  pcVar10 = glu::getGLSLVersionDeclaration(GVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,pcVar10,(allocator<char> *)&program);
  std::operator+(&fragmentSource,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program_1,
                 "\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main ()\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&program_1);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  pppSVar1 = &program_1.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_430 = 0;
  lVar12 = 0;
  while( true ) {
    if ((int)(((long)(this->m_cases).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_cases).
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= lVar12) break;
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_3d8 = lVar12;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program_1,"Case",(allocator<char> *)&fragmentShader);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program,
               *(char **)((long)&((this->m_cases).
                                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->description +
                         local_430),(allocator<char> *)&state);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&program_1,(string *)&program)
    ;
    std::__cxx11::string::~string((string *)&program);
    std::__cxx11::string::~string((string *)&program_1);
    pcVar10 = *(char **)((long)&((this->m_cases).
                                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->header + local_430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&program_1,
               "void main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n",
               (allocator<char> *)&program);
    std::operator+(&geometrySource,pcVar10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program_1);
    std::__cxx11::string::~string((string *)&program_1);
    pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
    memset((ProgramSources *)&program_1,0,0xac);
    program_1.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
    program_1.m_program.m_info.infoLog.field_2._M_local_buf[8] = '\0';
    program_1.m_program.m_info.infoLog.field_2._9_7_ = 0;
    program_1.m_program.m_info.linkOk = false;
    program_1.m_program.m_info._33_8_ = 0;
    glu::VertexSource::VertexSource((VertexSource *)&fragmentShader,&vertexSource);
    pPVar11 = glu::ProgramSources::operator<<
                        ((ProgramSources *)&program_1,(ShaderSource *)&fragmentShader);
    glu::FragmentSource::FragmentSource((FragmentSource *)&state,&fragmentSource);
    pPVar11 = glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&state);
    iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    fragSourcePtr = (char *)CONCAT44(fragSourcePtr._4_4_,iVar7);
    specializeShader((string *)&vtxSourcePtr,&geometrySource,(ContextType *)&fragSourcePtr);
    glu::GeometrySource::GeometrySource((GeometrySource *)&section_1,(string *)&vtxSourcePtr);
    pPVar11 = glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&section_1);
    glu::ShaderProgram::ShaderProgram(&program,pRVar3,pPVar11);
    std::__cxx11::string::~string((string *)local_410);
    std::__cxx11::string::~string((string *)&vtxSourcePtr);
    std::__cxx11::string::~string((string *)&state.m_postguard);
    std::__cxx11::string::~string((string *)&fragmentShader.m_shader);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&program_1);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program
                   );
    dVar9 = program.m_program.m_program;
    iVar7 = *(int *)((long)&((this->m_cases).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
                             ._M_impl.super__Vector_impl_data._M_start)->value + local_430);
    iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state);
    (**(code **)(CONCAT44(extraout_var,iVar8) + 0x9d8))(dVar9,this->m_target,&state.m_value);
    dVar9 = (**(code **)(CONCAT44(extraout_var,iVar8) + 0x800))();
    glu::checkError(dVar9,"getProgramiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0xfd6);
    program_1.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    fragmentShader.m_shader = this->m_target;
    fragmentShader.m_gl = (Functions *)glu::getProgramParamName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&fragmentShader,(ostream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1," = ");
    std::ostream::operator<<(pppSVar1,state.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    if (state.m_value != iVar7) {
      program_1.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)
                 &program_1.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      this_00 = &program_1.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::operator<<((ostream *)this_00,"// ERROR: Expected ");
      std::ostream::operator<<(this_00,iVar7);
      std::operator<<((ostream *)this_00,", got ");
      std::ostream::operator<<(this_00,state.m_value);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&program_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"got invalid value");
      }
    }
    glu::ShaderProgram::~ShaderProgram(&program);
    std::__cxx11::string::~string((string *)&geometrySource);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    lVar12 = local_3d8 + 1;
    local_430 = local_430 + 0x18;
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,"NoGeometryShader",(allocator<char> *)&fragmentShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"No geometry shader",(allocator<char> *)&state);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar2,(string *)&program_1,(string *)&program)
  ;
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&program_1);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&program,0,0xac);
  program.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  program.m_program.m_info.infoLog.field_2._M_local_buf[8] = '\0';
  program.m_program.m_info.infoLog.field_2._9_7_ = 0;
  program.m_program.m_info.linkOk = false;
  program.m_program.m_info._33_8_ = 0;
  glu::VertexSource::VertexSource((VertexSource *)&fragmentShader,&vertexSource);
  pPVar11 = glu::ProgramSources::operator<<
                      ((ProgramSources *)&program,(ShaderSource *)&fragmentShader);
  glu::FragmentSource::FragmentSource((FragmentSource *)&state,&fragmentSource);
  pPVar11 = glu::ProgramSources::operator<<(pPVar11,(ShaderSource *)&state);
  glu::ShaderProgram::ShaderProgram(&program_1,pRVar3,pPVar11);
  std::__cxx11::string::~string((string *)&state.m_postguard);
  std::__cxx11::string::~string((string *)&fragmentShader.m_shader);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program_1
                 );
  expectQueryError(this,program_1.m_program.m_program);
  glu::ShaderProgram::~ShaderProgram(&program_1);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,"NotLinkedProgram",(allocator<char> *)&fragmentShader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program,"Shader program not linked",(allocator<char> *)&state);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&program_1,(string *)&program);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&program_1);
  CVar5.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar6 = glu::getContextTypeGLSLVersion(CVar5);
  pcVar10 = glu::getGLSLVersionDeclaration(GVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state,pcVar10,(allocator<char> *)&fragSourcePtr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fragmentShader,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,"\n");
  pcVar10 = "#extension GL_EXT_geometry_shader : require\n";
  if (bVar4) {
    pcVar10 = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section_1,pcVar10,(allocator<char> *)&geomSourcePtr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fragmentShader,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                 "layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtxSourcePtr,
             "void main ()\n{\n\tgl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n\tEmitVertex();\n}\n",
             &local_439);
  std::operator+(&geometrySource,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vtxSourcePtr)
  ;
  std::__cxx11::string::~string((string *)&vtxSourcePtr);
  std::__cxx11::string::~string((string *)&program_1);
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string((string *)&section_1);
  std::__cxx11::string::~string((string *)&fragmentShader);
  std::__cxx11::string::~string((string *)&state);
  vtxSourcePtr = vertexSource._M_dataplus._M_p;
  fragSourcePtr = fragmentSource._M_dataplus._M_p;
  geomSourcePtr = geometrySource._M_dataplus._M_p;
  glu::Shader::Shader((Shader *)&program,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_VERTEX);
  glu::Shader::Shader(&fragmentShader,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_FRAGMENT);
  glu::Shader::Shader((Shader *)&state,((this->super_TestCase).m_context)->m_renderCtx,
                      SHADERTYPE_GEOMETRY);
  glu::Program::Program((Program *)&section_1,((this->super_TestCase).m_context)->m_renderCtx);
  glu::Shader::setSources((Shader *)&program,1,&vtxSourcePtr,(int *)0x0);
  glu::Shader::setSources(&fragmentShader,1,&fragSourcePtr,(int *)0x0);
  glu::Shader::setSources((Shader *)&state,1,&geomSourcePtr,(int *)0x0);
  glu::Shader::compile((Shader *)&program);
  glu::Shader::compile(&fragmentShader);
  glu::Shader::compile((Shader *)&state);
  if ((((char)program.m_shaders[3].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') &&
      (fragmentShader.m_info.compileOk == true)) && (local_378 != false)) {
    glu::Program::attachShader
              ((Program *)&section_1,
               (deUint32)
               program.m_shaders[0].
               super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    glu::Program::attachShader((Program *)&section_1,fragmentShader.m_shader);
    glu::Program::attachShader((Program *)&section_1,state.m_postguard);
    program_1.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pppSVar1 = &program_1.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::operator<<((ostream *)pppSVar1,
                    "Creating a program with geometry shader, but not linking it");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    expectQueryError(this,local_410[0]);
    glu::Program::~Program((Program *)&section_1);
    glu::Shader::~Shader((Shader *)&state);
    glu::Shader::~Shader(&fragmentShader);
    glu::Shader::~Shader((Shader *)&program);
    std::__cxx11::string::~string((string *)&geometrySource);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    std::__cxx11::string::~string((string *)&fragmentSource);
    std::__cxx11::string::~string((string *)&vertexSource);
    return STOP;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&program_1,"Failed to compile shader",&local_439);
  tcu::TestError::TestError(this_02,(string *)&program_1);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GeometryProgramQueryCase::IterateResult GeometryProgramQueryCase::iterate (void)
{
	const bool			supportsES32			= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	const std::string	vertexSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	const std::string	fragmentSource			= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
												  "layout(location = 0) out mediump vec4 fragColor;\n"
												  "void main ()\n"
												  "{\n"
												  "	fragColor = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "}\n";
	static const char*	s_geometryBody			="void main ()\n"
												  "{\n"
												  "	gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n"
												  "	EmitVertex();\n"
												  "}\n";

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// default cases
	for (int ndx = 0; ndx < (int)m_cases.size(); ++ndx)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "Case", m_cases[ndx].description);
		const std::string			geometrySource	= m_cases[ndx].header + std::string(s_geometryBody);
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource)
														<< glu::GeometrySource(specializeShader(geometrySource, m_context.getRenderContext().getType())));

		m_testCtx.getLog() << program;
		expectProgramValue(program.getProgram(), m_cases[ndx].value);
	}

	// no geometry shader -case (INVALID OP)
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "NoGeometryShader", "No geometry shader");
		const glu::ShaderProgram	program			(m_context.getRenderContext(),
														glu::ProgramSources()
														<< glu::VertexSource(vertexSource)
														<< glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << program;
		expectQueryError(program.getProgram());
	}

	// not linked -case (INVALID OP)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "NotLinkedProgram", "Shader program not linked");
		const std::string	geometrySource				= std::string(glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()))) + "\n"
														+ std::string(supportsES32 ? "" : "#extension GL_EXT_geometry_shader : require\n")
														+ "layout (triangles) in;\n"
														"layout (points, max_vertices = 3) out;\n"
														+ std::string(s_geometryBody);


		const char* const			vtxSourcePtr	= vertexSource.c_str();
		const char* const			fragSourcePtr	= fragmentSource.c_str();
		const char* const			geomSourcePtr	= geometrySource.c_str();

		glu::Shader					vertexShader	(m_context.getRenderContext(), glu::SHADERTYPE_VERTEX);
		glu::Shader					fragmentShader	(m_context.getRenderContext(), glu::SHADERTYPE_FRAGMENT);
		glu::Shader					geometryShader	(m_context.getRenderContext(), glu::SHADERTYPE_GEOMETRY);
		glu::Program				program			(m_context.getRenderContext());

		vertexShader.setSources(1, &vtxSourcePtr, DE_NULL);
		fragmentShader.setSources(1, &fragSourcePtr, DE_NULL);
		geometryShader.setSources(1, &geomSourcePtr, DE_NULL);

		vertexShader.compile();
		fragmentShader.compile();
		geometryShader.compile();

		if (!vertexShader.getCompileStatus()   ||
			!fragmentShader.getCompileStatus() ||
			!geometryShader.getCompileStatus())
			throw tcu::TestError("Failed to compile shader");

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		program.attachShader(geometryShader.getShader());

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating a program with geometry shader, but not linking it" << tcu::TestLog::EndMessage;

		expectQueryError(program.getProgram());
	}

	return STOP;
}